

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

uint __thiscall QLocale::toUInt(QLocale *this,QStringView s,bool *ok)

{
  QLocalePrivate *pQVar1;
  bool bVar2;
  uint uVar3;
  QSimpleParsedNumber<unsigned_long_long> QVar4;
  
  pQVar1 = (this->d).d.ptr;
  QVar4 = QLocaleData::stringToUnsLongLong
                    (pQVar1->m_data,s,10,
                     (NumberOptions)
                     (pQVar1->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                     super_QFlagsStorage<QLocale::NumberOption>.i);
  if (ok == (bool *)0x0) {
    bVar2 = QVar4.result >> 0x20 == 0;
  }
  else {
    bVar2 = QVar4.result >> 0x20 == 0;
    *ok = 0 < QVar4.used && bVar2;
  }
  uVar3 = 0;
  if (bVar2) {
    uVar3 = (uint)QVar4.result;
  }
  return uVar3;
}

Assistant:

uint QLocale::toUInt(QStringView s, bool *ok) const
{
    return toIntegral_helper<uint>(d, s, ok);
}